

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

void __thiscall llvm::cl::extrahelp::extrahelp(extrahelp *this,StringRef Help)

{
  iterator __position;
  atomic<void_*> aVar1;
  StringRef local_10;
  
  local_10.Length = Help.Length;
  local_10.Data = Help.Data;
  (this->morehelp).Data = local_10.Data;
  (this->morehelp).Length = local_10.Length;
  if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
    ManagedStaticBase::RegisterManagedStatic
              (&GlobalParser.super_ManagedStaticBase,
               object_creator<(anonymous_namespace)::CommandLineParser>::call,
               object_deleter<(anonymous_namespace)::CommandLineParser>::call);
  }
  aVar1._M_b._M_p = GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p;
  __position._M_current =
       *(StringRef **)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x38);
  if (__position._M_current ==
      *(StringRef **)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x40)) {
    std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
    _M_realloc_insert<llvm::StringRef_const&>
              ((vector<llvm::StringRef,std::allocator<llvm::StringRef>> *)
               ((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x30),__position,
               &local_10);
  }
  else {
    (__position._M_current)->Data = local_10.Data;
    (__position._M_current)->Length = local_10.Length;
    *(long *)((long)aVar1._M_b._M_p + 0x38) = *(long *)((long)aVar1._M_b._M_p + 0x38) + 0x10;
  }
  return;
}

Assistant:

extrahelp::extrahelp(StringRef Help) : morehelp(Help) {
  GlobalParser->MoreHelp.push_back(Help);
}